

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_publication.cpp
# Opt level: O0

CallResult __thiscall miniros::ServiceCallback::call(ServiceCallback *this)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  element_type *this_00;
  element_type *peVar4;
  SerializedMessage *in_RDI;
  SerializedMessage res_2;
  String error_string;
  bool enabled;
  exception *e;
  SerializedMessage res_1;
  bool ok;
  ServiceCallbackHelperCallParams params;
  SerializedMessage res;
  VoidConstPtr tracker;
  SerializedMessage *in_stack_fffffffffffffd78;
  ServiceCallbackHelperCallParams *in_stack_fffffffffffffd80;
  weak_ptr<const_void> *in_stack_fffffffffffffd88;
  ServiceCallbackHelperCallParams *in_stack_fffffffffffffd90;
  shared_array_uint8_t *in_stack_fffffffffffffd98;
  SerializedMessage *in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffddf;
  ServiceClientLink *in_stack_fffffffffffffde0;
  uint *in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe0f;
  undefined1 local_100 [128];
  undefined4 local_80;
  undefined4 local_6c;
  __shared_ptr local_20 [28];
  CallResult local_4;
  
  peVar3 = std::
           __shared_ptr_access<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4aaf35);
  ServiceClientLink::getConnection(peVar3);
  std::__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x4aaf45);
  bVar1 = Connection::isDropped((Connection *)0x4aaf4d);
  if (bVar1) {
    return Invalid;
  }
  std::shared_ptr<const_void>::shared_ptr((shared_ptr<const_void> *)0x4aaf70);
  if (((ulong)in_RDI[1].buf.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi & 1) != 0) {
    std::weak_ptr<const_void>::lock(in_stack_fffffffffffffd88);
    std::shared_ptr<const_void>::operator=
              ((shared_ptr<const_void> *)in_stack_fffffffffffffd80,
               (shared_ptr<const_void> *)in_stack_fffffffffffffd78);
    std::shared_ptr<const_void>::~shared_ptr((shared_ptr<const_void> *)0x4aafb7);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
    if (!bVar1) {
      local_6c = 0;
      serialization::serializeServiceResponse<unsigned_int>
                ((bool)in_stack_fffffffffffffe0f,in_stack_fffffffffffffe00);
      std::__shared_ptr_access<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x4aaffe);
      ServiceClientLink::processResponse
                (in_stack_fffffffffffffde0,(bool)in_stack_fffffffffffffddf,in_RDI);
      local_4 = Invalid;
      local_80 = 1;
      SerializedMessage::~SerializedMessage(&in_stack_fffffffffffffd80->request);
      goto LAB_004ab59e;
    }
  }
  ServiceCallbackHelperCallParams::ServiceCallbackHelperCallParams(in_stack_fffffffffffffd90);
  std::shared_ptr<unsigned_char[]>::shared_ptr
            ((shared_ptr<unsigned_char[]> *)in_stack_fffffffffffffd80,
             &in_stack_fffffffffffffd78->buf);
  SerializedMessage::SerializedMessage
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,(size_t)in_stack_fffffffffffffd90);
  SerializedMessage::operator=(&in_stack_fffffffffffffd80->request,in_stack_fffffffffffffd78);
  SerializedMessage::~SerializedMessage(&in_stack_fffffffffffffd80->request);
  std::shared_ptr<unsigned_char[]>::~shared_ptr((shared_ptr<unsigned_char[]> *)0x4ab0f4);
  peVar3 = std::
           __shared_ptr_access<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4ab102);
  ServiceClientLink::getConnection(peVar3);
  this_00 = std::__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4ab112);
  Connection::getHeader(this_00);
  Header::getValues_abi_cxx11_((Header *)in_stack_fffffffffffffd78);
  std::
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator=((shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)in_stack_fffffffffffffd80,
              (shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)in_stack_fffffffffffffd78);
  std::
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~shared_ptr((shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)0x4ab159);
  peVar4 = std::
           __shared_ptr_access<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4ab167);
  uVar2 = (*peVar4->_vptr_ServiceCallbackHelper[2])(peVar4,local_100);
  if ((uVar2 & 1) == 0) {
    serialization::serializeServiceResponse<unsigned_int>
              ((bool)in_stack_fffffffffffffe0f,in_stack_fffffffffffffe00);
    std::__shared_ptr_access<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x4ab249);
    ServiceClientLink::processResponse
              (in_stack_fffffffffffffde0,(bool)in_stack_fffffffffffffddf,in_RDI);
    SerializedMessage::~SerializedMessage(&in_stack_fffffffffffffd80->request);
  }
  else {
    std::__shared_ptr_access<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x4ab1a6);
    ServiceClientLink::processResponse
              (in_stack_fffffffffffffde0,(bool)in_stack_fffffffffffffddf,in_RDI);
  }
  local_4 = Success;
  local_80 = 1;
  ServiceCallbackHelperCallParams::~ServiceCallbackHelperCallParams(in_stack_fffffffffffffd80);
LAB_004ab59e:
  std::shared_ptr<const_void>::~shared_ptr((shared_ptr<const_void> *)0x4ab5ab);
  return local_4;
}

Assistant:

virtual CallResult call()
  {
    if (link_->getConnection()->isDropped())
    {
      return Invalid;
    }

    VoidConstPtr tracker;
    if (has_tracked_object_)
    {
      tracker = tracked_object_.lock();

      if (!tracker)
      {
        SerializedMessage res = serialization::serializeServiceResponse<uint32_t>(false, 0);
        link_->processResponse(false, res);
        return Invalid;
      }
    }

    ServiceCallbackHelperCallParams params;
    params.request = SerializedMessage(buffer_, num_bytes_);
    params.connection_header = link_->getConnection()->getHeader().getValues();
    try
    {

      bool ok = helper_->call(params);
      if (ok)
      {
        link_->processResponse(true, params.response);
      }
      else
      {
        SerializedMessage res = serialization::serializeServiceResponse<uint32_t>(false, 0);
        link_->processResponse(false, res);
      }
    }
    catch (std::exception& e)
    {
      MINIROS_ERROR("Exception thrown while processing service call: %s", e.what());
      std_msgs::String error_string;
      error_string.data = e.what();
      SerializedMessage res = serialization::serializeServiceResponse(false, error_string);
      link_->processResponse(false, res);
      return Invalid;
    }

    return Success;
  }